

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListDatatypeValidator.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::ListDatatypeValidator::getCanonicalRepresentation
          (ListDatatypeValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  int iVar1;
  BaseRefVectorOf<char16_t> *tokenVector;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  DatatypeValidator *pDVar3;
  char16_t *pcVar4;
  XMLCh *src;
  XMLCh *__dest;
  undefined7 in_register_00000009;
  uint uVar5;
  long lVar6;
  XMLCh *oldBuf;
  XMLCh *local_50;
  XMLCh *__src;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = (this->super_AbstractStringValidator).super_DatatypeValidator.fMemoryManager;
  }
  this->fContent = rawData;
  tokenVector = XMLString::tokenizeString(rawData,memMgr);
  if ((int)CONCAT71(in_register_00000009,toValidate) != 0) {
    checkContent(this,tokenVector,rawData,(ValidationContext *)0x0,false,memMgr);
  }
  XVar2 = XMLString::stringLen(rawData);
  iVar1 = (*memMgr->_vptr_MemoryManager[3])(memMgr,XVar2 * 4);
  __src = (XMLCh *)CONCAT44(extraout_var,iVar1);
  lVar6 = XVar2 * 2;
  *__src = L'\0';
  pDVar3 = getItemTypeDTV(this);
  local_50 = __src;
  for (uVar5 = 0; (ulong)uVar5 < tokenVector->fCurCount; uVar5 = uVar5 + 1) {
    pcVar4 = BaseRefVectorOf<char16_t>::elementAt(tokenVector,(ulong)uVar5);
    iVar1 = (*(pDVar3->super_XSerializable)._vptr_XSerializable[7])(pDVar3,pcVar4,memMgr,0);
    src = (XMLCh *)CONCAT44(extraout_var_00,iVar1);
    XVar2 = XMLString::stringLen(src);
    if (__src + lVar6 <= local_50 + XVar2 + 2) {
      iVar1 = (*memMgr->_vptr_MemoryManager[3])(memMgr,lVar6 * 8);
      __dest = (XMLCh *)CONCAT44(extraout_var_01,iVar1);
      memcpy(__dest,__src,lVar6 * 2);
      (*memMgr->_vptr_MemoryManager[4])(memMgr,__src);
      local_50 = (XMLCh *)(((long)local_50 - (long)__src) + (long)__dest);
      lVar6 = lVar6 << 2;
      __src = __dest;
    }
    XMLString::catString(local_50,src);
    (local_50 + XVar2)[0] = L' ';
    (local_50 + XVar2)[1] = L'\0';
    (*memMgr->_vptr_MemoryManager[4])(memMgr,src);
    local_50 = local_50 + XVar2 + 1;
  }
  (*tokenVector->_vptr_BaseRefVectorOf[1])(tokenVector);
  return __src;
}

Assistant:

const XMLCh* ListDatatypeValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                             ,       MemoryManager* const memMgr
                                                             ,       bool                 toValidate) const
{
    MemoryManager* toUse = memMgr? memMgr : getMemoryManager();
    ListDatatypeValidator* temp = (ListDatatypeValidator*) this;
    temp->setContent(rawData);
    BaseRefVectorOf<XMLCh>* tokenVector = XMLString::tokenizeString(rawData, toUse);
    Janitor<BaseRefVectorOf<XMLCh> > janName(tokenVector);    

    if (toValidate)
    {
        try
        {
            temp->checkContent(tokenVector, rawData, 0, false, toUse);
        }
        catch (...)
        {
            return 0;
        }
    }
   
    XMLSize_t retBufSize = 2 * XMLString::stringLen(rawData);
    XMLCh* retBuf = (XMLCh*) toUse->allocate(retBufSize * sizeof(XMLCh));
    retBuf[0] = 0;
    XMLCh* retBufPtr = retBuf;
    DatatypeValidator* itemDv = this->getItemTypeDTV();

    try 
    {
        for (unsigned int i = 0; i < tokenVector->size(); i++)
        {
            XMLCh* itemCanRep = (XMLCh*) itemDv->getCanonicalRepresentation(tokenVector->elementAt(i), toUse, false);
            XMLSize_t itemLen = XMLString::stringLen(itemCanRep); 

            if(retBufPtr+itemLen+2 >= retBuf+retBufSize)
            {
                // need to resize
                XMLCh * oldBuf = retBuf;
                retBuf = (XMLCh*) toUse->allocate(retBufSize * sizeof(XMLCh) * 4);
                memcpy(retBuf, oldBuf, retBufSize * sizeof(XMLCh ));
                retBufPtr = (retBufPtr - oldBuf) + retBuf;
                toUse->deallocate(oldBuf);
                retBufSize <<= 2;
            }

            XMLString::catString(retBufPtr, itemCanRep);
            retBufPtr = retBufPtr + itemLen;
            *(retBufPtr++) = chSpace;
            *(retBufPtr) = chNull;
            toUse->deallocate(itemCanRep);
        }

        return retBuf;

    }
    catch (...)
    {
        return 0;
    }
}